

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNnameConstraintsTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section13InvalidDNnameConstraintsTest8<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.13.8";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b94c0,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b9590,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNnameConstraintsTest8) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN4CACert",
                               "InvalidDNnameConstraintsTest8EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN4CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.8";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}